

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppgenerator.cpp
# Opt level: O0

void __thiscall CppGenerator::operator()(CppGenerator *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_type sVar7;
  size_type sVar8;
  ulong uVar9;
  void *__s;
  void *__s_00;
  _List_iterator<QString> *p_Var10;
  _List_iterator<State> *p_Var11;
  pointer pIVar12;
  CppGenerator *pCVar13;
  pointer pRVar14;
  QTextStream *pQVar15;
  qsizetype qVar16;
  pointer pSVar17;
  reference piVar18;
  reference piVar19;
  int *piVar20;
  char *pcVar21;
  QTextStream *pQVar22;
  char *pcVar23;
  long in_RDI;
  long in_FS_OFFSET;
  int *r_3;
  int j_3;
  int i_2;
  int r_2;
  int i_1;
  int *mx;
  int j_2;
  int *u_2;
  int j_1;
  int i;
  int *u_1;
  int j;
  int q;
  int *u;
  Name *s;
  NameSet *__range3;
  int r_1;
  int r;
  int symbol;
  int q_1;
  int reduce_reduce_conflict_count;
  int shift_reduce_conflict_count;
  int *pgoto;
  int *table;
  QTextStream out_4;
  QFile f_4;
  QTextStream out_3;
  QFile f_3;
  QTextStream out_2;
  QFile f_2;
  QString prot;
  QTextStream out_1;
  QFile f_1;
  QString bitsFileName;
  QString declFileName;
  QTextStream out;
  QFile f;
  RulePointer rule_1;
  StatePointer state_2;
  iterator rule;
  StatePointer state_1;
  QBitArray used_rules;
  TokenInfo info_s;
  TokenInfo info_r;
  iterator __end3;
  iterator __begin3;
  ItemPointer item;
  iterator a;
  StatePointer state;
  NameSet lookaheads;
  undefined4 in_stack_fffffffffffff8f8;
  OpenModeFlag in_stack_fffffffffffff8fc;
  _List_iterator<Rule> in_stack_fffffffffffff900;
  FILE *pFVar24;
  Automaton *in_stack_fffffffffffff908;
  QLatin1Char ch;
  Rule *in_stack_fffffffffffff910;
  StatePointer in_stack_fffffffffffff918;
  QString *in_stack_fffffffffffff920;
  undefined8 in_stack_fffffffffffff938;
  QList<int> *in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff968;
  int in_stack_fffffffffffff96c;
  undefined4 in_stack_fffffffffffff980;
  Assoc in_stack_fffffffffffff984;
  QTextStream *in_stack_fffffffffffff998;
  CppGenerator *in_stack_fffffffffffff9a0;
  bool local_64d;
  int local_5f8;
  int local_5f4;
  int local_5ec;
  int local_5dc;
  int local_5c8;
  int local_5c4;
  int *in_stack_fffffffffffffa40;
  int in_stack_fffffffffffffa48;
  int iVar25;
  Compress *in_stack_fffffffffffffa50;
  int local_588;
  int local_584;
  undefined1 local_568 [24];
  undefined8 local_550;
  undefined8 local_548;
  QString local_540 [3];
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined1 local_4e0 [24];
  undefined8 local_4c8;
  undefined8 local_4c0;
  QString local_4b8 [3];
  undefined8 local_468;
  undefined8 local_460;
  undefined1 local_458 [24];
  undefined8 local_440;
  undefined8 local_438;
  QString local_430 [3];
  undefined8 local_3e0;
  undefined8 local_3d8;
  undefined1 local_3d0 [24];
  undefined1 local_3b8 [25];
  QLatin1Char local_39f;
  ushort local_39e;
  QLatin1Char local_39b;
  ushort local_39a;
  undefined1 local_398 [24];
  undefined8 local_380;
  undefined8 local_378;
  undefined8 local_370;
  undefined8 local_368;
  undefined8 local_360;
  QString local_358 [3];
  undefined8 local_308;
  undefined8 local_300;
  QLatin1StringView local_2f8;
  QString local_2a8;
  QLatin1StringView local_290;
  QString local_240;
  undefined1 local_228 [24];
  undefined1 local_210 [24];
  undefined1 local_1f8 [24];
  undefined1 local_1e0 [24];
  undefined1 local_1c8 [24];
  undefined1 local_1b0 [24];
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_168;
  undefined8 local_160;
  _Self local_158;
  _Self local_150;
  _Self local_148;
  _Self local_140;
  _Self local_138;
  _Self local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined1 local_110 [8];
  TokenInfo local_108;
  undefined1 local_100 [8];
  TokenInfo local_f8;
  _Self local_f0;
  int local_e4;
  Recognizer *local_e0;
  _Self local_d8;
  _Self local_d0;
  _List_node_base *local_c8;
  _Self local_c0;
  _Self local_b8;
  _Self local_b0;
  _List_node_base *local_a8;
  _List_node_base *local_a0;
  _List_node_base *local_98;
  iterator local_90;
  iterator local_88;
  _List_node_base *local_80;
  _Self local_78;
  _Self local_70;
  undefined1 local_68 [48];
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sVar7 = std::__cxx11::list<State,_std::allocator<State>_>::size
                    ((list<State,_std::allocator<State>_> *)0x10bc81);
  *(int *)(in_RDI + 0x20) = (int)sVar7;
  sVar8 = std::
          set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
          ::size((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                  *)0x10bc9f);
  *(int *)(in_RDI + 0x24) = (int)sVar8;
  sVar8 = std::
          set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
          ::size((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                  *)0x10bcbd);
  *(int *)(in_RDI + 0x28) = (int)sVar8;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(*(int *)(in_RDI + 0x20) * *(int *)(in_RDI + 0x24));
  uVar9 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  __s = operator_new__(uVar9);
  memset(__s,0,(long)(*(int *)(in_RDI + 0x20) * *(int *)(in_RDI + 0x24)) << 2);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(*(int *)(in_RDI + 0x20) * *(int *)(in_RDI + 0x28));
  uVar9 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  __s_00 = operator_new__(uVar9);
  memset(__s_00,0,(long)(*(int *)(in_RDI + 0x20) * *(int *)(in_RDI + 0x28)) << 2);
  *(undefined4 *)(in_RDI + 0x1c) = 0xffffffff;
  local_584 = 0;
  local_588 = 0;
  local_70._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
  local_70._M_node =
       (_List_node_base *)
       std::__cxx11::list<State,_std::allocator<State>_>::begin(in_stack_fffffffffffff900._M_node);
  while( true ) {
    local_78._M_node =
         (_List_node_base *)
         std::__cxx11::list<State,_std::allocator<State>_>::end(in_stack_fffffffffffff900._M_node);
    bVar3 = std::operator!=(&local_70,&local_78);
    if (!bVar3) break;
    local_80 = local_70._M_node;
    iVar25 = Automaton::id(in_stack_fffffffffffff908,in_stack_fffffffffffff918);
    local_88._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    std::_List_iterator<State>::operator->((_List_iterator<State> *)0x10be4e);
    local_88._M_node =
         (_Base_ptr)
         QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::begin
                   ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)
                    in_stack_fffffffffffff910);
    while( true ) {
      std::_List_iterator<State>::operator->((_List_iterator<State> *)0x10be6f);
      local_90._M_node =
           (_Base_ptr)
           QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::end
                     ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)
                      in_stack_fffffffffffff910);
      bVar3 = ::operator!=((iterator *)in_stack_fffffffffffff900._M_node,
                           (iterator *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8)
                          );
      if (!bVar3) break;
      p_Var10 = QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::iterator::key
                          ((iterator *)0x10bec2);
      local_98 = p_Var10->_M_node;
      iVar5 = Automaton::id(in_stack_fffffffffffff908,(Name)in_stack_fffffffffffff918._M_node);
      p_Var11 = QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::iterator::value
                          ((iterator *)0x10bf0c);
      local_a0 = p_Var11->_M_node;
      iVar4 = Automaton::id(in_stack_fffffffffffff908,in_stack_fffffffffffff918);
      p_Var10 = QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::iterator::key
                          ((iterator *)0x10bf56);
      local_a8 = p_Var10->_M_node;
      bVar3 = Grammar::isNonTerminal
                        ((Grammar *)in_stack_fffffffffffff900._M_node,
                         (Name)in_stack_fffffffffffff918._M_node);
      if (bVar3) {
        *(int *)((long)__s_00 +
                (long)(iVar25 * *(int *)(in_RDI + 0x28) + (iVar5 - *(int *)(in_RDI + 0x24))) * 4) =
             iVar4;
      }
      else {
        *(int *)((long)__s + (long)(iVar25 * *(int *)(in_RDI + 0x24) + iVar5) * 4) = iVar4;
      }
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::iterator::operator++
                ((iterator *)in_stack_fffffffffffff900._M_node);
    }
    local_b0._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
    std::_List_iterator<State>::operator->((_List_iterator<State> *)0x10c011);
    local_b0._M_node =
         (_List_node_base *)
         std::__cxx11::list<Item,_std::allocator<Item>_>::begin(in_stack_fffffffffffff900._M_node);
    while( true ) {
      std::_List_iterator<State>::operator->((_List_iterator<State> *)0x10c032);
      local_b8._M_node =
           (_List_node_base *)
           std::__cxx11::list<Item,_std::allocator<Item>_>::end(in_stack_fffffffffffff900._M_node);
      bVar3 = std::operator!=(&local_b0,&local_b8);
      if (!bVar3) break;
      pIVar12 = std::_List_iterator<Item>::operator->((_List_iterator<Item> *)0x10c071);
      std::_List_iterator<Item>::operator->((_List_iterator<Item> *)0x10c08a);
      local_c0._M_node =
           (_List_node_base *)
           Item::end_rhs((Item *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
      bVar3 = std::operator!=(&pIVar12->dot,&local_c0);
      if (!bVar3) {
        pIVar12 = std::_List_iterator<Item>::operator->((_List_iterator<Item> *)0x10c0db);
        local_c8 = (pIVar12->rule)._M_node;
        iVar5 = Automaton::id(in_stack_fffffffffffff908,
                              (RulePointer)in_stack_fffffffffffff918._M_node);
        memset(local_38,0xaa,0x30);
        memset(local_68,0,0x30);
        std::
        set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
        ::set((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
               *)0x10c152);
        QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
        ::value((QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                 *)in_stack_fffffffffffff920,
                (_List_iterator<Item> *)in_stack_fffffffffffff918._M_node,
                (set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                 *)in_stack_fffffffffffff910);
        std::
        set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
        ::~set((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                *)0x10c184);
        pIVar12 = std::_List_iterator<Item>::operator->((_List_iterator<Item> *)0x10c191);
        bVar3 = std::operator==(&pIVar12->rule,(_Self *)(*(long *)(in_RDI + 8) + 0x120));
        if (bVar3) {
          *(int *)(in_RDI + 0x1c) = iVar25;
        }
        local_d0._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
        local_d0._M_node =
             (_Base_ptr)
             std::
             set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
             ::begin((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                      *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        local_d8._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
        local_d8._M_node =
             (_Base_ptr)
             std::
             set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
             ::end((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                    *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        while (bVar3 = std::operator!=(&local_d0,&local_d8), bVar3) {
          pCVar13 = (CppGenerator *)
                    std::_Rb_tree_const_iterator<std::_List_iterator<QString>_>::operator*
                              ((_Rb_tree_const_iterator<std::_List_iterator<QString>_> *)0x10c26b);
          iVar4 = *(int *)(in_RDI + 0x24);
          local_e0 = pCVar13->p;
          iVar6 = Automaton::id(in_stack_fffffffffffff908,(Name)in_stack_fffffffffffff918._M_node);
          in_stack_fffffffffffffa50 = (Compress *)((long)__s + (long)(iVar25 * iVar4 + iVar6) * 4);
          if (*(int *)&(in_stack_fffffffffffffa50->index).d.d == 0) {
            *(int *)&(in_stack_fffffffffffffa50->index).d.d = -iVar5;
          }
          else if (*(int *)&(in_stack_fffffffffffffa50->index).d.d < 0) {
            if ((*(byte *)(in_RDI + 0x18) & 1) != 0) {
              pQVar15 = qout();
              pQVar15 = (QTextStream *)
                        QTextStream::operator<<
                                  (pQVar15,"*** Warning. Found a reduce/reduce conflict in state ");
              pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,iVar25);
              QTextStream::operator<<(pQVar15," on token ``");
              pQVar15 = operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                                   (Name *)CONCAT44(in_stack_fffffffffffff8fc,
                                                    in_stack_fffffffffffff8f8));
              pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"\'\' between rule ");
              pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,iVar5);
              pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15," and ");
              QTextStream::operator<<(pQVar15,-*(int *)&(in_stack_fffffffffffffa50->index).d.d);
              operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                         (QTextStreamFunction)
                         CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
            }
            local_588 = local_588 + 1;
            local_e4 = -iVar5;
            piVar20 = qMax<int>((int *)in_stack_fffffffffffffa50,&local_e4);
            *(int *)&(in_stack_fffffffffffffa50->index).d.d = *piVar20;
            if ((*(byte *)(in_RDI + 0x18) & 1) != 0) {
              pQVar15 = qout();
              pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"\tresolved using rule ");
              QTextStream::operator<<(pQVar15,-*(int *)&(in_stack_fffffffffffffa50->index).d.d);
              operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                         (QTextStreamFunction)
                         CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
            }
          }
          else if (0 < *(int *)&(in_stack_fffffffffffffa50->index).d.d) {
            std::_List_iterator<Item>::operator->((_List_iterator<Item> *)0x10c482);
            pRVar14 = std::_List_iterator<Rule>::operator->((_List_iterator<Rule> *)0x10c48a);
            local_f0._M_node =
                 (_List_node_base *)
                 std::__cxx11::list<QString,_std::allocator<QString>_>::end
                           (in_stack_fffffffffffff900._M_node);
            bVar3 = std::operator!=(&pRVar14->prec,&local_f0);
            local_64d = false;
            if (bVar3) {
              local_64d = QMap<std::_List_iterator<QString>,_Grammar::TokenInfo>::contains
                                    ((QMap<std::_List_iterator<QString>,_Grammar::TokenInfo> *)
                                     in_stack_fffffffffffff910,
                                     (_List_iterator<QString> *)in_stack_fffffffffffff908);
            }
            if (local_64d == false) {
              local_584 = local_584 + 1;
              if ((*(byte *)(in_RDI + 0x18) & 1) != 0) {
                pQVar15 = qout();
                pQVar15 = (QTextStream *)
                          QTextStream::operator<<
                                    (pQVar15,"*** Warning. Found a shift/reduce conflict in state ")
                ;
                pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,iVar25);
                QTextStream::operator<<(pQVar15," on token ``");
                pQVar15 = operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                                     (Name *)CONCAT44(in_stack_fffffffffffff8fc,
                                                      in_stack_fffffffffffff8f8));
                pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"\'\' with rule ");
                QTextStream::operator<<(pQVar15,iVar5);
                operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                           (QTextStreamFunction)
                           CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
              }
            }
            else {
              local_f8.assoc = 0xaaaaaaaa;
              local_f8.prec = -0x55555556;
              std::_List_iterator<Item>::operator->((_List_iterator<Item> *)0x10c54a);
              std::_List_iterator<Rule>::operator->((_List_iterator<Rule> *)0x10c552);
              memset(local_100,0,8);
              local_f8 = QMap<std::_List_iterator<QString>,_Grammar::TokenInfo>::value
                                   ((QMap<std::_List_iterator<QString>,_Grammar::TokenInfo> *)
                                    in_stack_fffffffffffff910,
                                    (_List_iterator<QString> *)in_stack_fffffffffffff908,
                                    (TokenInfo *)in_stack_fffffffffffff900._M_node);
              local_108.assoc = 0xaaaaaaaa;
              local_108.prec = -0x55555556;
              in_stack_fffffffffffff998 = (QTextStream *)(*(long *)(in_RDI + 8) + 0x170);
              memset(local_110,0,8);
              local_108 = QMap<std::_List_iterator<QString>,_Grammar::TokenInfo>::value
                                    ((QMap<std::_List_iterator<QString>,_Grammar::TokenInfo> *)
                                     in_stack_fffffffffffff910,
                                     (_List_iterator<QString> *)in_stack_fffffffffffff908,
                                     (TokenInfo *)in_stack_fffffffffffff900._M_node);
              in_stack_fffffffffffff9a0 = pCVar13;
              if (local_108.prec < local_f8.prec) {
                *(int *)&(in_stack_fffffffffffffa50->index).d.d = -iVar5;
              }
              else if (local_f8.prec == local_108.prec) {
                in_stack_fffffffffffff984 = local_f8.assoc;
                if (local_f8.assoc == NonAssoc) {
                  *(int *)&(in_stack_fffffffffffffa50->index).d.d = 0;
                }
                else if (local_f8.assoc == Left) {
                  *(int *)&(in_stack_fffffffffffffa50->index).d.d = -iVar5;
                }
              }
            }
          }
          std::_Rb_tree_const_iterator<std::_List_iterator<QString>_>::operator++
                    ((_Rb_tree_const_iterator<std::_List_iterator<QString>_> *)
                     in_stack_fffffffffffff900._M_node);
        }
        std::
        set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
        ::~set((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                *)0x10c756);
      }
      std::_List_iterator<Item>::operator++(&local_b0);
    }
    std::_List_iterator<State>::operator++(&local_70);
  }
  if ((local_584 != 0) || (local_588 != 0)) {
    if ((local_584 != *(int *)(*(long *)(in_RDI + 8) + 0x168)) ||
       (local_588 != *(int *)(*(long *)(in_RDI + 8) + 0x16c))) {
      pQVar15 = qerr();
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"*** Conflicts: ");
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,local_584);
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15," shift/reduce, ");
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,local_588);
      QTextStream::operator<<(pQVar15," reduce/reduce");
      operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
      if ((*(byte *)(in_RDI + 0x2e) & 1) != 0) {
        pQVar15 = qerr();
        QTextStream::operator<<
                  (pQVar15,
                   "qlalr: error: warning occurred, treating as error due to --exit-on-warn.");
        operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                   (QTextStreamFunction)
                   CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        exit(2);
      }
    }
    if ((*(byte *)(in_RDI + 0x18) & 1) != 0) {
      qout();
      pQVar15 = operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                           (QTextStreamFunction)
                           CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,"*** Conflicts: ");
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,local_584);
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15," shift/reduce, ");
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,local_588);
      QTextStream::operator<<(pQVar15," reduce/reduce");
      operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
      operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
    }
  }
  local_128 = 0xaaaaaaaaaaaaaaaa;
  local_120 = 0xaaaaaaaaaaaaaaaa;
  local_118 = 0xaaaaaaaaaaaaaaaa;
  sVar7 = std::__cxx11::list<Rule,_std::allocator<Rule>_>::size
                    ((list<Rule,_std::allocator<Rule>_> *)0x10c93c);
  QBitArray::QBitArray((QBitArray *)&local_128,(long)(int)sVar7,false);
  iVar25 = 0;
  local_130._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
  local_130._M_node =
       (_List_node_base *)
       std::__cxx11::list<State,_std::allocator<State>_>::begin(in_stack_fffffffffffff900._M_node);
  while( true ) {
    local_138._M_node =
         (_List_node_base *)
         std::__cxx11::list<State,_std::allocator<State>_>::end(in_stack_fffffffffffff900._M_node);
    bVar3 = std::operator!=(&local_130,&local_138);
    if (!bVar3) break;
    for (in_stack_fffffffffffffa48 = 0; in_stack_fffffffffffffa48 < *(int *)(in_RDI + 0x24);
        in_stack_fffffffffffffa48 = in_stack_fffffffffffffa48 + 1) {
      in_stack_fffffffffffffa40 =
           (int *)((long)__s +
                  (long)(iVar25 * *(int *)(in_RDI + 0x24) + in_stack_fffffffffffffa48) * 4);
      if (*in_stack_fffffffffffffa40 < 0) {
        QBitArray::setBit((QBitArray *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8)
                          ,0x10ca55);
      }
    }
    std::_List_iterator<State>::operator++(&local_130);
    iVar25 = iVar25 + 1;
  }
  local_140._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
  local_140._M_node =
       (_List_node_base *)
       std::__cxx11::list<Rule,_std::allocator<Rule>_>::begin(in_stack_fffffffffffff900._M_node);
  local_5c4 = 0;
  while( true ) {
    pQVar15 = (QTextStream *)(long)local_5c4;
    qVar16 = QBitArray::size((QBitArray *)in_stack_fffffffffffff900._M_node);
    if (qVar16 <= (long)pQVar15) break;
    bVar3 = QBitArray::testBit((QBitArray *)in_stack_fffffffffffff900._M_node,
                               CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
    if ((!bVar3) &&
       (bVar3 = std::operator!=(&local_140,(_Self *)(*(long *)(in_RDI + 8) + 0x120)), bVar3)) {
      pQVar15 = qerr();
      QTextStream::operator<<(pQVar15,"*** Warning: Rule ``");
      std::_List_iterator<Rule>::operator*((_List_iterator<Rule> *)0x10cb69);
      pQVar15 = operator<<((QTextStream *)in_stack_fffffffffffff918._M_node,
                           in_stack_fffffffffffff910);
      QTextStream::operator<<(pQVar15,"\'\' is useless!");
      operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
      if ((*(byte *)(in_RDI + 0x2e) & 1) != 0) {
        pQVar15 = qerr();
        QTextStream::operator<<
                  (pQVar15,
                   "qlalr: error: warning occurred, treating as error due to --exit-on-warn.");
        operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                   (QTextStreamFunction)
                   CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        exit(2);
      }
    }
    local_5c4 = local_5c4 + 1;
    std::_List_iterator<Rule>::operator++(&local_140);
  }
  iVar25 = 0;
  local_148._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
  local_148._M_node =
       (_List_node_base *)
       std::__cxx11::list<State,_std::allocator<State>_>::begin(in_stack_fffffffffffff900._M_node);
  while( true ) {
    local_150._M_node =
         (_List_node_base *)
         std::__cxx11::list<State,_std::allocator<State>_>::end(in_stack_fffffffffffff900._M_node);
    bVar3 = std::operator!=(&local_148,&local_150);
    if (!bVar3) break;
    for (local_5c8 = 0; local_5c8 < *(int *)(in_RDI + 0x24); local_5c8 = local_5c8 + 1) {
      piVar20 = (int *)((long)__s + (long)(iVar25 * *(int *)(in_RDI + 0x24) + local_5c8) * 4);
      if (*piVar20 < 0) {
        local_158._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
        std::__cxx11::list<Rule,_std::allocator<Rule>_>::begin
                  ((list<Rule,_std::allocator<Rule>_> *)in_stack_fffffffffffff900._M_node);
        local_158._M_node =
             (_List_node_base *)
             std::next<std::_List_iterator<Rule>>
                       (in_stack_fffffffffffff900,
                        CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        pSVar17 = std::_List_iterator<State>::operator->((_List_iterator<State> *)0x10cd48);
        bVar3 = std::operator==(&pSVar17->defaultReduce,&local_158);
        if (bVar3) {
          *piVar20 = 0;
        }
      }
    }
    std::_List_iterator<State>::operator++(&local_148);
    iVar25 = iVar25 + 1;
  }
  QList<int>::resize((QList<int> *)in_stack_fffffffffffff910,(qsizetype)in_stack_fffffffffffff908);
  for (local_5dc = 0; local_5dc < *(int *)(in_RDI + 0x28); local_5dc = local_5dc + 1) {
    QList<int>::fill(in_stack_fffffffffffff940,
                     (parameter_type)((ulong)in_stack_fffffffffffff938 >> 0x20),
                     CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
    piVar18 = QList<int>::operator[]
                        ((QList<int> *)in_stack_fffffffffffff900._M_node,
                         CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
    for (local_5ec = 0; local_5ec < *(int *)(in_RDI + 0x20); local_5ec = local_5ec + 1) {
      iVar5 = *(int *)((long)__s_00 + (long)(local_5ec * *(int *)(in_RDI + 0x28) + local_5dc) * 4);
      if (iVar5 != 0) {
        piVar19 = QList<int>::operator[]
                            ((QList<int> *)in_stack_fffffffffffff900._M_node,
                             CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        *piVar19 = *piVar19 + 1;
        piVar19 = QList<int>::operator[]
                            ((QList<int> *)in_stack_fffffffffffff900._M_node,
                             CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        in_stack_fffffffffffff96c = *piVar19;
        piVar19 = QList<int>::operator[]
                            ((QList<int> *)in_stack_fffffffffffff900._M_node,
                             CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        if (*piVar19 < in_stack_fffffffffffff96c) {
          *piVar18 = iVar5;
        }
      }
    }
  }
  for (local_5f4 = 0; local_5f4 < *(int *)(in_RDI + 0x20); local_5f4 = local_5f4 + 1) {
    for (local_5f8 = 0; local_5f8 < *(int *)(in_RDI + 0x28); local_5f8 = local_5f8 + 1) {
      piVar20 = (int *)((long)__s_00 + (long)(local_5f4 * *(int *)(in_RDI + 0x28) + local_5f8) * 4);
      iVar5 = *piVar20;
      piVar18 = QList<int>::operator[]
                          ((QList<int> *)in_stack_fffffffffffff900._M_node,
                           CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
      if (iVar5 == *piVar18) {
        *piVar20 = 0;
      }
    }
  }
  Compress::operator()
            (in_stack_fffffffffffffa50,(int *)CONCAT44(iVar25,in_stack_fffffffffffffa48),
             (int)((ulong)in_stack_fffffffffffffa40 >> 0x20),(int)in_stack_fffffffffffffa40);
  Compress::operator()
            (in_stack_fffffffffffffa50,(int *)CONCAT44(iVar25,in_stack_fffffffffffffa48),
             (int)((ulong)in_stack_fffffffffffffa40 >> 0x20),(int)in_stack_fffffffffffffa40);
  if (__s != (void *)0x0) {
    operator_delete__(__s);
  }
  if (__s_00 != (void *)0x0) {
    operator_delete__(__s_00);
  }
  bVar3 = QString::isEmpty((QString *)0x10d0ed);
  if (!bVar3) {
    local_168 = 0xaaaaaaaaaaaaaaaa;
    local_160 = 0xaaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_168,*(QString **)(in_RDI + 8));
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffff900._M_node,
               in_stack_fffffffffffff8fc);
    uVar9 = QFile::open((QFlags *)&local_168);
    pFVar24 = _stderr;
    if ((uVar9 & 1) == 0) {
      QtPrivate::asString(*(QString **)(in_RDI + 8));
      QString::toLocal8Bit((QString *)in_stack_fffffffffffff918._M_node);
      pcVar21 = QByteArray::constData((QByteArray *)0x10d193);
      fprintf(pFVar24,"*** cannot create %s\n",pcVar21);
      QByteArray::~QByteArray((QByteArray *)0x10d1b6);
    }
    else {
      local_198 = 0xaaaaaaaaaaaaaaaa;
      local_190 = 0xaaaaaaaaaaaaaaaa;
      QTextStream::QTextStream((QTextStream *)&local_198,(QIODevice *)&local_168);
      if ((*(byte *)(in_RDI + 0x2d) & 1) != 0) {
        copyrightHeader((CppGenerator *)in_stack_fffffffffffff918._M_node);
        pQVar22 = (QTextStream *)
                  QTextStream::operator<<((QTextStream *)&local_198,(QString *)local_1b0);
        privateCopyrightHeader((CppGenerator *)in_stack_fffffffffffff918._M_node);
        QTextStream::operator<<(pQVar22,(QString *)local_1c8);
        operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                   (QTextStreamFunction)
                   CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        QString::~QString((QString *)0x10d279);
        QString::~QString((QString *)0x10d286);
      }
      QTextStream::operator<<
                ((QTextStream *)&local_198,"// This file was generated by qlalr - DO NOT EDIT!\n");
      startIncludeGuard((QString *)in_stack_fffffffffffff918._M_node);
      QTextStream::operator<<((QTextStream *)&local_198,(QString *)local_1e0);
      operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
      QString::~QString((QString *)0x10d2e4);
      if ((*(byte *)(in_RDI + 0x2d) & 1) != 0) {
        QTextStream::operator<<((QTextStream *)&local_198,"#if defined(ERROR)");
        pQVar22 = operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                             (QTextStreamFunction)
                             CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        QTextStream::operator<<(pQVar22,"#  undef ERROR");
        pQVar22 = operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                             (QTextStreamFunction)
                             CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        QTextStream::operator<<(pQVar22,"#endif");
        operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                   (QTextStreamFunction)
                   CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                   (QTextStreamFunction)
                   CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
      }
      generateDecl((CppGenerator *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                   pQVar15);
      generateImpl(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      Recognizer::decls((Recognizer *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
      QTextStream::operator<<((QTextStream *)&local_198,(QString *)local_1f8);
      QString::~QString((QString *)0x10d3c4);
      Recognizer::impls((Recognizer *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
      QTextStream::operator<<((QTextStream *)&local_198,(QString *)local_210);
      QString::~QString((QString *)0x10d3fe);
      operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
      endIncludeGuard(in_stack_fffffffffffff920);
      QTextStream::operator<<((QTextStream *)&local_198,(QString *)local_228);
      operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
      QString::~QString((QString *)0x10d45c);
      QTextStream::~QTextStream((QTextStream *)&local_198);
    }
    QFile::~QFile((QFile *)&local_168);
    goto LAB_0010e165;
  }
  local_240.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_240.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_240.d.size = -0x5555555555555556;
  QString::toLower((QString *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
  local_290 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffff908,(size_t)in_stack_fffffffffffff900._M_node
                        );
  operator+((QString *)in_stack_fffffffffffff908,(QLatin1String *)in_stack_fffffffffffff900._M_node)
  ;
  QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<QString,_QLatin1String> *)
             CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
  QStringBuilder<QString,_QLatin1String>::~QStringBuilder
            ((QStringBuilder<QString,_QLatin1String> *)0x10d530);
  QString::~QString((QString *)0x10d53d);
  local_2a8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_2a8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_2a8.d.size = -0x5555555555555556;
  QString::toLower((QString *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
  local_2f8 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffff908,(size_t)in_stack_fffffffffffff900._M_node
                        );
  operator+((QString *)in_stack_fffffffffffff908,(QLatin1String *)in_stack_fffffffffffff900._M_node)
  ;
  ch.ch = (char)((ulong)in_stack_fffffffffffff908 >> 0x38);
  QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<QString,_QLatin1String> *)
             CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
  QStringBuilder<QString,_QLatin1String>::~QStringBuilder
            ((QStringBuilder<QString,_QLatin1String> *)0x10d5e7);
  QString::~QString((QString *)0x10d5f4);
  local_308 = 0xaaaaaaaaaaaaaaaa;
  local_300 = 0xaaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_308,(QString *)&local_240);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffff900._M_node,
             in_stack_fffffffffffff8fc);
  uVar9 = QFile::open((QFlags *)&local_308);
  if ((uVar9 & 1) == 0) {
    pFVar24 = _stderr;
    QtPrivate::asString(&local_240);
    QString::toLocal8Bit((QString *)in_stack_fffffffffffff918._M_node);
    pcVar21 = QByteArray::constData((QByteArray *)0x10d68e);
    QIODevice::errorString();
    QtPrivate::asString(local_358);
    QString::toLocal8Bit((QString *)in_stack_fffffffffffff918._M_node);
    pcVar23 = QByteArray::constData((QByteArray *)0x10d6d2);
    fprintf(pFVar24,"*** cannot create %s: %s\n",pcVar21,pcVar23);
    QByteArray::~QByteArray((QByteArray *)0x10d6fa);
    QString::~QString((QString *)0x10d707);
    QByteArray::~QByteArray((QByteArray *)0x10d714);
    bVar3 = true;
  }
  else {
    local_368 = 0xaaaaaaaaaaaaaaaa;
    local_360 = 0xaaaaaaaaaaaaaaaa;
    QTextStream::QTextStream((QTextStream *)&local_368,(QIODevice *)&local_308);
    local_380 = 0xaaaaaaaaaaaaaaaa;
    local_378 = 0xaaaaaaaaaaaaaaaa;
    local_370 = 0xaaaaaaaaaaaaaaaa;
    QString::toUpper((QString *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
    QLatin1Char::QLatin1Char(&local_39b,'.');
    QChar::QChar<QLatin1Char,_true>((QChar *)in_stack_fffffffffffff900._M_node,ch);
    QLatin1Char::QLatin1Char(&local_39f,'_');
    QChar::QChar<QLatin1Char,_true>((QChar *)in_stack_fffffffffffff900._M_node,ch);
    QString::replace((QChar *)local_398,(QChar *)(ulong)local_39a,(uint)local_39e);
    QString::QString((QString *)in_stack_fffffffffffff900._M_node,
                     (QString *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
    QString::~QString((QString *)0x10d829);
    if ((*(byte *)(in_RDI + 0x2d) & 1) != 0) {
      copyrightHeader((CppGenerator *)in_stack_fffffffffffff918._M_node);
      pQVar22 = (QTextStream *)
                QTextStream::operator<<((QTextStream *)&local_368,(QString *)local_3b8);
      privateCopyrightHeader((CppGenerator *)in_stack_fffffffffffff918._M_node);
      QTextStream::operator<<(pQVar22,(QString *)local_3d0);
      operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
      QString::~QString((QString *)0x10d8a9);
      QString::~QString((QString *)0x10d8b6);
    }
    QTextStream::operator<<
              ((QTextStream *)&local_368,"// This file was generated by qlalr - DO NOT EDIT!\n");
    pQVar22 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_368,"#ifndef ");
    QTextStream::operator<<(pQVar22,(QString *)&local_380);
    pQVar22 = operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                         (QTextStreamFunction)
                         CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
    pQVar22 = (QTextStream *)QTextStream::operator<<(pQVar22,"#define ");
    QTextStream::operator<<(pQVar22,(QString *)&local_380);
    operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
               (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
    operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
               (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
    if ((*(byte *)(in_RDI + 0x2d) & 1) != 0) {
      QTextStream::operator<<((QTextStream *)&local_368,"#include <QtCore/qglobal.h>");
      operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
      operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
      QTextStream::operator<<((QTextStream *)&local_368,"QT_BEGIN_NAMESPACE");
      operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
      operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
    }
    generateDecl((CppGenerator *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                 pQVar15);
    if ((*(byte *)(in_RDI + 0x2d) & 1) != 0) {
      QTextStream::operator<<((QTextStream *)&local_368,"QT_END_NAMESPACE");
      operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
    }
    pQVar15 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_368,"#endif // ");
    QTextStream::operator<<(pQVar15,(QString *)&local_380);
    operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
               (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
    operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
               (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
    QString::~QString((QString *)0x10da41);
    QTextStream::~QTextStream((QTextStream *)&local_368);
    bVar3 = false;
  }
  QFile::~QFile((QFile *)&local_308);
  if (!bVar3) {
    local_3e0 = 0xaaaaaaaaaaaaaaaa;
    local_3d8 = 0xaaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_3e0,(QString *)&local_2a8);
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffff900._M_node,
               in_stack_fffffffffffff8fc);
    uVar9 = QFile::open((QFlags *)&local_3e0);
    if ((uVar9 & 1) == 0) {
      pFVar24 = _stderr;
      QtPrivate::asString(&local_2a8);
      QString::toLocal8Bit((QString *)in_stack_fffffffffffff918._M_node);
      pcVar21 = QByteArray::constData((QByteArray *)0x10db11);
      QIODevice::errorString();
      QtPrivate::asString(local_430);
      QString::toLocal8Bit((QString *)in_stack_fffffffffffff918._M_node);
      pcVar23 = QByteArray::constData((QByteArray *)0x10db55);
      fprintf(pFVar24,"*** cannot create %s: %s\n",pcVar21,pcVar23);
      QByteArray::~QByteArray((QByteArray *)0x10db7d);
      QString::~QString((QString *)0x10db8a);
      QByteArray::~QByteArray((QByteArray *)0x10db97);
      bVar3 = true;
    }
    else {
      local_440 = 0xaaaaaaaaaaaaaaaa;
      local_438 = 0xaaaaaaaaaaaaaaaa;
      QTextStream::QTextStream((QTextStream *)&local_440,(QIODevice *)&local_3e0);
      if ((*(byte *)(in_RDI + 0x2d) & 1) != 0) {
        copyrightHeader((CppGenerator *)in_stack_fffffffffffff918._M_node);
        QTextStream::operator<<((QTextStream *)&local_440,(QString *)local_458);
        QString::~QString((QString *)0x10dc1f);
      }
      QTextStream::operator<<
                ((QTextStream *)&local_440,"// This file was generated by qlalr - DO NOT EDIT!\n");
      pQVar15 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_440,"#include \"");
      pQVar15 = (QTextStream *)QTextStream::operator<<(pQVar15,(QString *)&local_240);
      QTextStream::operator<<(pQVar15,"\"");
      operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
      operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                 (QTextStreamFunction)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8))
      ;
      if ((*(byte *)(in_RDI + 0x2d) & 1) != 0) {
        QTextStream::operator<<((QTextStream *)&local_440,"QT_BEGIN_NAMESPACE");
        operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                   (QTextStreamFunction)
                   CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                   (QTextStreamFunction)
                   CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
      }
      generateImpl(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      if ((*(byte *)(in_RDI + 0x2d) & 1) != 0) {
        QTextStream::operator<<((QTextStream *)&local_440,"QT_END_NAMESPACE");
        operator<<((QTextStream *)in_stack_fffffffffffff900._M_node,
                   (QTextStreamFunction)
                   CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
      }
      QTextStream::~QTextStream((QTextStream *)&local_440);
      bVar3 = false;
    }
    QFile::~QFile((QFile *)&local_3e0);
    if (!bVar3) {
      bVar3 = QString::isEmpty((QString *)0x10dd55);
      if (!bVar3) {
        local_468 = 0xaaaaaaaaaaaaaaaa;
        local_460 = 0xaaaaaaaaaaaaaaaa;
        QFile::QFile((QFile *)&local_468,(QString *)(*(long *)(in_RDI + 8) + 0x30));
        QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                  ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffff900._M_node,
                   in_stack_fffffffffffff8fc);
        uVar9 = QFile::open((QFlags *)&local_468);
        bVar3 = (uVar9 & 1) != 0;
        if (bVar3) {
          local_4c8 = 0xaaaaaaaaaaaaaaaa;
          local_4c0 = 0xaaaaaaaaaaaaaaaa;
          QTextStream::QTextStream((QTextStream *)&local_4c8,(QIODevice *)&local_468);
          Recognizer::decls((Recognizer *)
                            CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
          QTextStream::operator<<((QTextStream *)&local_4c8,(QString *)local_4e0);
          QString::~QString((QString *)0x10df0a);
          QTextStream::~QTextStream((QTextStream *)&local_4c8);
        }
        else {
          pFVar24 = _stderr;
          QtPrivate::asString((QString *)(*(long *)(in_RDI + 8) + 0x30));
          QString::toLocal8Bit((QString *)in_stack_fffffffffffff918._M_node);
          in_stack_fffffffffffff918._M_node =
               (_List_node_base *)QByteArray::constData((QByteArray *)0x10de07);
          QIODevice::errorString();
          QtPrivate::asString(local_4b8);
          QString::toLocal8Bit((QString *)in_stack_fffffffffffff918._M_node);
          pcVar21 = QByteArray::constData((QByteArray *)0x10de4b);
          fprintf(pFVar24,"*** cannot create %s: %s\n",in_stack_fffffffffffff918._M_node,pcVar21);
          QByteArray::~QByteArray((QByteArray *)0x10de73);
          QString::~QString((QString *)0x10de80);
          QByteArray::~QByteArray((QByteArray *)0x10de8d);
        }
        QFile::~QFile((QFile *)&local_468);
        if (!bVar3) goto LAB_0010e14b;
      }
      bVar3 = QString::isEmpty((QString *)0x10df57);
      if (!bVar3) {
        local_4f0 = 0xaaaaaaaaaaaaaaaa;
        local_4e8 = 0xaaaaaaaaaaaaaaaa;
        QFile::QFile((QFile *)&local_4f0,(QString *)(*(long *)(in_RDI + 8) + 0x48));
        QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                  ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffff900._M_node,
                   in_stack_fffffffffffff8fc);
        uVar9 = QFile::open((QFlags *)&local_4f0);
        if ((uVar9 & 1) == 0) {
          pFVar24 = _stderr;
          QtPrivate::asString((QString *)(*(long *)(in_RDI + 8) + 0x48));
          QString::toLocal8Bit((QString *)in_stack_fffffffffffff918._M_node);
          pcVar21 = QByteArray::constData((QByteArray *)0x10e009);
          QIODevice::errorString();
          QtPrivate::asString(local_540);
          QString::toLocal8Bit((QString *)in_stack_fffffffffffff918._M_node);
          pcVar23 = QByteArray::constData((QByteArray *)0x10e04d);
          fprintf(pFVar24,"*** cannot create %s: %s\n",pcVar21,pcVar23);
          QByteArray::~QByteArray((QByteArray *)0x10e075);
          QString::~QString((QString *)0x10e082);
          QByteArray::~QByteArray((QByteArray *)0x10e08f);
        }
        else {
          local_550 = 0xaaaaaaaaaaaaaaaa;
          local_548 = 0xaaaaaaaaaaaaaaaa;
          QTextStream::QTextStream((QTextStream *)&local_550,(QIODevice *)&local_4f0);
          Recognizer::impls((Recognizer *)
                            CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
          QTextStream::operator<<((QTextStream *)&local_550,(QString *)local_568);
          QString::~QString((QString *)0x10e10c);
          QTextStream::~QTextStream((QTextStream *)&local_550);
        }
        QFile::~QFile((QFile *)&local_4f0);
      }
    }
  }
LAB_0010e14b:
  QString::~QString((QString *)0x10e158);
  QString::~QString((QString *)0x10e165);
LAB_0010e165:
  QBitArray::~QBitArray((QBitArray *)0x10e172);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CppGenerator::operator () ()
{
  // action table...
  state_count = static_cast<int>(aut.states.size());
  terminal_count = static_cast<int>(grammar.terminals.size());
  non_terminal_count = static_cast<int>(grammar.non_terminals.size());

#define ACTION(i, j) table [(i) * terminal_count + (j)]
#define GOTO(i, j) pgoto [(i) * non_terminal_count + (j)]

  int *table = new int [state_count * terminal_count];
  ::memset (table, 0, state_count * terminal_count * sizeof (int));

  int *pgoto = new int [state_count * non_terminal_count];
  ::memset (pgoto, 0, state_count * non_terminal_count * sizeof (int));

  accept_state = -1;
  int shift_reduce_conflict_count = 0;
  int reduce_reduce_conflict_count = 0;

  for (StatePointer state = aut.states.begin (); state != aut.states.end (); ++state)
    {
      int q = aut.id (state);

      for (Bundle::iterator a = state->bundle.begin (); a != state->bundle.end (); ++a)
        {
          int symbol = aut.id (a.key ());
          int r = aut.id (a.value ());

          Q_ASSERT (r < state_count);

          if (grammar.isNonTerminal (a.key ()))
            {
              Q_ASSERT(symbol >= terminal_count && symbol < static_cast<int>(grammar.names.size()));
              GOTO (q, symbol - terminal_count) = r;
            }

          else
            ACTION (q, symbol) = r;
        }

      for (ItemPointer item = state->closure.begin (); item != state->closure.end (); ++item)
        {
          if (item->dot != item->end_rhs ())
            continue;

          int r = aut.id (item->rule);

          const NameSet lookaheads = aut.lookaheads.value (item);

          if (item->rule == grammar.goal)
            accept_state = q;

          for (const Name &s : lookaheads)
            {
              int &u = ACTION (q, aut.id (s));

              if (u == 0)
                u = - r;

              else if (u < 0)
                {
                  if (verbose)
                    qout() << "*** Warning. Found a reduce/reduce conflict in state " << q << " on token ``" << s << "'' between rule "
                         << r << " and " << -u << Qt::endl;

                  ++reduce_reduce_conflict_count;

                  u = qMax (u, -r);

                  if (verbose)
                    qout() << "\tresolved using rule " << -u << Qt::endl;
                }

              else if (u > 0)
                {
                  if (item->rule->prec != grammar.names.end() && grammar.token_info.contains (s))
                    {
                      Grammar::TokenInfo info_r = grammar.token_info.value (item->rule->prec);
                      Grammar::TokenInfo info_s = grammar.token_info.value (s);

                      if (info_r.prec > info_s.prec)
                        u = -r;
                      else if (info_r.prec == info_s.prec)
                        {
                          switch (info_r.assoc) {
                          case Grammar::Left:
                            u = -r;
                            break;
                          case Grammar::Right:
                            // shift... nothing to do
                            break;
                          case Grammar::NonAssoc:
                            u = 0;
                            break;
                          } // switch
                        }
                    }

                  else
                    {
                      ++shift_reduce_conflict_count;

                      if (verbose)
                        qout() << "*** Warning. Found a shift/reduce conflict in state " << q << " on token ``" << s << "'' with rule " << r << Qt::endl;
                    }
                }
            }
        }
    }

  if (shift_reduce_conflict_count || reduce_reduce_conflict_count)
    {
      if (shift_reduce_conflict_count != grammar.expected_shift_reduce
          || reduce_reduce_conflict_count != grammar.expected_reduce_reduce)
        {
          qerr() << "*** Conflicts: " << shift_reduce_conflict_count << " shift/reduce, " << reduce_reduce_conflict_count << " reduce/reduce" << Qt::endl;
          if (warnings_are_errors)
            {
              qerr() << "qlalr: error: warning occurred, treating as error due to "
                        "--exit-on-warn." << Qt::endl;
              exit(2);
            }
        }

      if (verbose)
        qout() << Qt::endl << "*** Conflicts: " << shift_reduce_conflict_count << " shift/reduce, " << reduce_reduce_conflict_count << " reduce/reduce" << Qt::endl
             << Qt::endl;
    }

  QBitArray used_rules{static_cast<int>(grammar.rules.size())};

  int q = 0;
  for (StatePointer state = aut.states.begin (); state != aut.states.end (); ++state, ++q)
    {
      for (int j = 0; j < terminal_count; ++j)
        {
          int &u = ACTION (q, j);

          if (u < 0)
            used_rules.setBit (-u - 1);
        }
    }

  auto rule = grammar.rules.begin();
  for (int i = 0; i < used_rules.size(); ++i, ++rule)
    {
      if (! used_rules.testBit (i))
        {
          if (rule != grammar.goal)
            {
              qerr() << "*** Warning: Rule ``" << *rule << "'' is useless!" << Qt::endl;
              if (warnings_are_errors)
                {
                  qerr() << "qlalr: error: warning occurred, treating as error due to "
                            "--exit-on-warn." << Qt::endl;
                  exit(2);
                }
            }
        }
    }

  q = 0;
  for (StatePointer state = aut.states.begin (); state != aut.states.end (); ++state, ++q)
    {
      for (int j = 0; j < terminal_count; ++j)
        {
          int &u = ACTION (q, j);

          if (u >= 0)
            continue;

          RulePointer rule = std::next(grammar.rules.begin(), - u - 1);

          if (state->defaultReduce == rule)
            u = 0;
        }
    }

  // ... compress the goto table
  defgoto.resize (non_terminal_count);
  for (int j = 0; j < non_terminal_count; ++j)
    {
      count.fill (0, state_count);

      int &mx = defgoto [j];

      for (int i = 0; i < state_count; ++i)
        {
          int r = GOTO (i, j);

          if (! r)
            continue;

          ++count [r];

          if (count [r] > count [mx])
            mx = r;
        }
    }

  for (int i = 0; i < state_count; ++i)
    {
      for (int j = 0; j < non_terminal_count; ++j)
        {
          int &r = GOTO (i, j);

          if (r == defgoto [j])
            r = 0;
        }
    }

  compressed_action (table, state_count, terminal_count);
  compressed_goto (pgoto, state_count, non_terminal_count);

  delete[] table;
  table = nullptr;

  delete[] pgoto;
  pgoto = nullptr;

#undef ACTION
#undef GOTO

  if (! grammar.merged_output.isEmpty())
    {
      QFile f(grammar.merged_output);
      if (! f.open (QFile::WriteOnly))
        {
          fprintf (stderr, "*** cannot create %s\n", qPrintable(grammar.merged_output));
          return;
        }

      QTextStream out (&f);

      // copyright headers must come first, otherwise the headers tests will fail
      if (copyright)
        {
          out << copyrightHeader()
              << privateCopyrightHeader()
              << Qt::endl;
        }

      out << "// This file was generated by qlalr - DO NOT EDIT!\n";

      out << startIncludeGuard(grammar.merged_output) << Qt::endl;

      if (copyright) {
          out << "#if defined(ERROR)" << Qt::endl
              << "#  undef ERROR" << Qt::endl
              << "#endif" << Qt::endl << Qt::endl;
      }

      generateDecl (out);
      generateImpl (out);
      out << p.decls();
      out << p.impls();
      out << Qt::endl;

      out << endIncludeGuard(grammar.merged_output) << Qt::endl;

      return;
    }

  // default behaviour
  QString declFileName = grammar.table_name.toLower () + "_p.h"_L1;
  QString bitsFileName = grammar.table_name.toLower () + ".cpp"_L1;

  { // decls...
    QFile f (declFileName);
    if (! f.open (QFile::WriteOnly))
      {
        fprintf (stderr, "*** cannot create %s: %s\n",
                 qPrintable(declFileName), qPrintable(f.errorString()));
        return;
      }
    QTextStream out (&f);

    QString prot = declFileName.toUpper ().replace (QLatin1Char ('.'), QLatin1Char ('_'));

    // copyright headers must come first, otherwise the headers tests will fail
    if (copyright)
      {
        out << copyrightHeader()
            << privateCopyrightHeader()
            << Qt::endl;
      }

    out << "// This file was generated by qlalr - DO NOT EDIT!\n";

    out << "#ifndef " << prot << Qt::endl
        << "#define " << prot << Qt::endl
        << Qt::endl;

    if (copyright) {
        out << "#include <QtCore/qglobal.h>" << Qt::endl << Qt::endl;
        out << "QT_BEGIN_NAMESPACE" << Qt::endl << Qt::endl;
    }
    generateDecl (out);
    if (copyright)
        out << "QT_END_NAMESPACE" << Qt::endl;

    out << "#endif // " << prot << Qt::endl << Qt::endl;
  } // end decls

  { // bits...
    QFile f (bitsFileName);
    if (! f.open (QFile::WriteOnly))
      {
        fprintf (stderr, "*** cannot create %s: %s\n",
                 qPrintable(bitsFileName), qPrintable(f.errorString()));
        return;
      }
    QTextStream out (&f);

    // copyright headers must come first, otherwise the headers tests will fail
    if (copyright)
      out << copyrightHeader();

    out << "// This file was generated by qlalr - DO NOT EDIT!\n";

    out << "#include \"" << declFileName << "\"" << Qt::endl << Qt::endl;
    if (copyright)
        out << "QT_BEGIN_NAMESPACE" << Qt::endl << Qt::endl;
    generateImpl(out);
    if (copyright)
        out << "QT_END_NAMESPACE" << Qt::endl;

  } // end bits

  if (! grammar.decl_file_name.isEmpty ())
    {
      QFile f (grammar.decl_file_name);
      if (! f.open (QFile::WriteOnly))
        {
          fprintf (stderr, "*** cannot create %s: %s\n",
                   qPrintable(grammar.decl_file_name), qPrintable(f.errorString()));
          return;
        }
      QTextStream out (&f);
      out << p.decls();
    }

  if (! grammar.impl_file_name.isEmpty ())
    {
      QFile f (grammar.impl_file_name);
      if (! f.open (QFile::WriteOnly))
        {
          fprintf (stderr, "*** cannot create %s: %s\n",
                   qPrintable(grammar.impl_file_name), qPrintable(f.errorString()));
          return;
        }
      QTextStream out (&f);
      out << p.impls();
    }
}